

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

_Bool riscv_stop_interrupt(uc_struct_conflict12 *uc,int intno)

{
  int intno_local;
  uc_struct_conflict12 *uc_local;
  
  if (intno == 3) {
    uc->invalid_error = 0x15;
    uc_local._7_1_ = true;
  }
  else if (intno == 0x8888) {
    uc_local._7_1_ = true;
  }
  else {
    uc_local._7_1_ = false;
  }
  return uc_local._7_1_;
}

Assistant:

static bool riscv_stop_interrupt(struct uc_struct *uc, int intno)
{
    // detect stop exception
    switch (intno) {
    default:
        return false;
    case RISCV_EXCP_UNICORN_END:
        return true;
    case RISCV_EXCP_BREAKPOINT:
        uc->invalid_error = UC_ERR_EXCEPTION;
        return true;
    }
}